

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5Tests.cpp
# Opt level: O0

int __thiscall glcts::GPUShader5Tests::init(GPUShader5Tests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  GPUShader5SamplerArrayIndexing *this_00;
  GPUShader5ImagesArrayIndexing *this_01;
  GPUShader5AtomicCountersArrayIndexing *this_02;
  GPUShader5UniformBlocksArrayIndexing *this_03;
  GPUShader5SSBOArrayIndexing *this_04;
  GPUShader5PreciseQualifier *this_05;
  GPUShader5FmaAccuracyTest *this_06;
  GPUShader5FmaPrecision<(glcts::INPUT_DATA_TYPE)1> *this_07;
  GPUShader5FmaPrecision<(glcts::INPUT_DATA_TYPE)2> *this_08;
  GPUShader5FmaPrecision<(glcts::INPUT_DATA_TYPE)3> *this_09;
  GPUShader5FmaPrecision<(glcts::INPUT_DATA_TYPE)4> *this_10;
  GPUShader5TextureGatherOffsetColor2DRepeatCaseTest *this_11;
  TestNode *pTVar1;
  GPUShader5TextureGatherOffsetColor2DOffsetsCaseTest *this_12;
  GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest *this_13;
  GPUShader5TextureGatherOffsetDepth2DOffsetsCaseTest *this_14;
  GPUShader5Tests *this_local;
  
  tcu::TestNode::init((TestNode *)this,ctx);
  this_00 = (GPUShader5SamplerArrayIndexing *)operator_new(0x2d8);
  GPUShader5SamplerArrayIndexing::GPUShader5SamplerArrayIndexing
            (this_00,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams,"sampler_array_indexing","Test 1");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  this_01 = (GPUShader5ImagesArrayIndexing *)operator_new(0x2e0);
  GPUShader5ImagesArrayIndexing::GPUShader5ImagesArrayIndexing
            (this_01,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams,"images_array_indexing","Test 2");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  this_02 = (GPUShader5AtomicCountersArrayIndexing *)operator_new(0x2c0);
  GPUShader5AtomicCountersArrayIndexing::GPUShader5AtomicCountersArrayIndexing
            (this_02,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams,"atomic_counters_array_indexing","Test 3")
  ;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_02);
  this_03 = (GPUShader5UniformBlocksArrayIndexing *)operator_new(0x2d0);
  GPUShader5UniformBlocksArrayIndexing::GPUShader5UniformBlocksArrayIndexing
            (this_03,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams,"uniform_blocks_array_indexing","Test 4");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_03);
  if (10 < (int)this->m_glslVersion) {
    this_04 = (GPUShader5SSBOArrayIndexing *)operator_new(0x2c0);
    GPUShader5SSBOArrayIndexing::GPUShader5SSBOArrayIndexing
              (this_04,(this->super_TestCaseGroupBase).m_context,
               &(this->super_TestCaseGroupBase).m_extParams,"ssbo_array_indexing","Test 5");
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_04);
  }
  this_05 = (GPUShader5PreciseQualifier *)operator_new(0x2d0);
  GPUShader5PreciseQualifier::GPUShader5PreciseQualifier
            (this_05,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams,"precise_qualifier","Test 6");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_05);
  this_06 = (GPUShader5FmaAccuracyTest *)operator_new(0x2d0);
  GPUShader5FmaAccuracyTest::GPUShader5FmaAccuracyTest
            (this_06,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams,"fma_accuracy","Test 7");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_06);
  this_07 = (GPUShader5FmaPrecision<(glcts::INPUT_DATA_TYPE)1> *)operator_new(0x788);
  GPUShader5FmaPrecision<(glcts::INPUT_DATA_TYPE)1>::GPUShader5FmaPrecision
            (this_07,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams,"fma_precision_float","Test 8 float");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_07);
  this_08 = (GPUShader5FmaPrecision<(glcts::INPUT_DATA_TYPE)2> *)operator_new(0xc38);
  GPUShader5FmaPrecision<(glcts::INPUT_DATA_TYPE)2>::GPUShader5FmaPrecision
            (this_08,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams,"fma_precision_vec2","Test 8 vec2");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_08);
  this_09 = (GPUShader5FmaPrecision<(glcts::INPUT_DATA_TYPE)3> *)operator_new(0x10e8);
  GPUShader5FmaPrecision<(glcts::INPUT_DATA_TYPE)3>::GPUShader5FmaPrecision
            (this_09,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams,"fma_precision_vec3","Test 8 vec3");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_09);
  this_10 = (GPUShader5FmaPrecision<(glcts::INPUT_DATA_TYPE)4> *)operator_new(0x1598);
  GPUShader5FmaPrecision<(glcts::INPUT_DATA_TYPE)4>::GPUShader5FmaPrecision
            (this_10,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams,"fma_precision_vec4","Test 8 vec4");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_10);
  this_11 = (GPUShader5TextureGatherOffsetColor2DRepeatCaseTest *)operator_new(0x390);
  GPUShader5TextureGatherOffsetColor2DRepeatCaseTest::
  GPUShader5TextureGatherOffsetColor2DRepeatCaseTest
            (this_11,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams,"texture_gather_offset_color_repeat",
             "Test 9 - Color repeat case");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_11);
  pTVar1 = (TestNode *)operator_new(0x390);
  GPUShader5TextureGatherOffsetColor2DArrayCaseTest::
  GPUShader5TextureGatherOffsetColor2DArrayCaseTest
            ((GPUShader5TextureGatherOffsetColor2DArrayCaseTest *)pTVar1,
             (this->super_TestCaseGroupBase).m_context,&(this->super_TestCaseGroupBase).m_extParams,
             "texture_gather_offset_color_array","Test 9 - Color texture array case");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_12 = (GPUShader5TextureGatherOffsetColor2DOffsetsCaseTest *)operator_new(0x398);
  GPUShader5TextureGatherOffsetColor2DOffsetsCaseTest::
  GPUShader5TextureGatherOffsetColor2DOffsetsCaseTest
            (this_12,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams,"texture_gather_offsets_color",
             "Test 9 - Color offsets case");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_12);
  this_13 = (GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest *)operator_new(0x390);
  GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest::
  GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest
            (this_13,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams,"texture_gather_offset_depth_repeat",
             "Test 10 - Depth repeat case");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_13);
  pTVar1 = (TestNode *)operator_new(0x390);
  GPUShader5TextureGatherOffsetDepth2DRepeatYCaseTest::
  GPUShader5TextureGatherOffsetDepth2DRepeatYCaseTest
            ((GPUShader5TextureGatherOffsetDepth2DRepeatYCaseTest *)pTVar1,
             (this->super_TestCaseGroupBase).m_context,&(this->super_TestCaseGroupBase).m_extParams,
             "texture_gather_offset_depth_repeat_y","Test 10 - Depth repeat, vertical case");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x390);
  GPUShader5TextureGatherOffsetDepth2DArrayCaseTest::
  GPUShader5TextureGatherOffsetDepth2DArrayCaseTest
            ((GPUShader5TextureGatherOffsetDepth2DArrayCaseTest *)pTVar1,
             (this->super_TestCaseGroupBase).m_context,&(this->super_TestCaseGroupBase).m_extParams,
             "texture_gather_offset_depth_array","Test 10 - Depth array case");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_14 = (GPUShader5TextureGatherOffsetDepth2DOffsetsCaseTest *)operator_new(0x398);
  GPUShader5TextureGatherOffsetDepth2DOffsetsCaseTest::
  GPUShader5TextureGatherOffsetDepth2DOffsetsCaseTest
            (this_14,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams,"texture_gather_offsets_depth",
             "Test 10 - Depth offsets case");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_14);
  pTVar1 = (TestNode *)operator_new(0x390);
  GPUShader5TextureGatherOffsetColor2DClampToBorderCaseTest::
  GPUShader5TextureGatherOffsetColor2DClampToBorderCaseTest
            ((GPUShader5TextureGatherOffsetColor2DClampToBorderCaseTest *)pTVar1,
             (this->super_TestCaseGroupBase).m_context,&(this->super_TestCaseGroupBase).m_extParams,
             "texture_gather_offset_color_clamp_to_border","Test 11 - Color clamp to border case");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x390);
  GPUShader5TextureGatherOffsetColor2DClampToEdgeCaseTest::
  GPUShader5TextureGatherOffsetColor2DClampToEdgeCaseTest
            ((GPUShader5TextureGatherOffsetColor2DClampToEdgeCaseTest *)pTVar1,
             (this->super_TestCaseGroupBase).m_context,&(this->super_TestCaseGroupBase).m_extParams,
             "texture_gather_offset_color_clamp_to_edge","Test 11 - Color clamp to edge case");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x390);
  GPUShader5TextureGatherOffsetDepth2DClampToBorderCaseTest::
  GPUShader5TextureGatherOffsetDepth2DClampToBorderCaseTest
            ((GPUShader5TextureGatherOffsetDepth2DClampToBorderCaseTest *)pTVar1,
             (this->super_TestCaseGroupBase).m_context,&(this->super_TestCaseGroupBase).m_extParams,
             "texture_gather_offset_depth_clamp_border","Test 11 - Depth clamp to border case");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x390);
  GPUShader5TextureGatherOffsetDepth2DClampToEdgeCaseTest::
  GPUShader5TextureGatherOffsetDepth2DClampToEdgeCaseTest
            ((GPUShader5TextureGatherOffsetDepth2DClampToEdgeCaseTest *)pTVar1,
             (this->super_TestCaseGroupBase).m_context,&(this->super_TestCaseGroupBase).m_extParams,
             "texture_gather_offset_depth_clamp_edge","Test 11 - Depth clamp to edge case");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void GPUShader5Tests::init(void)
{
	/* Base class init */
	TestCaseGroupBase::init();

	/* Sampler Array Indexing (Test 1) */
	addChild(new GPUShader5SamplerArrayIndexing(m_context, m_extParams, "sampler_array_indexing", "Test 1"));

	/* Images Array Indexing (Test 2) */
	addChild(new GPUShader5ImagesArrayIndexing(m_context, m_extParams, "images_array_indexing", "Test 2"));

	/* Atomic Counters Array Indexing (Test 3) */
	addChild(
		new GPUShader5AtomicCountersArrayIndexing(m_context, m_extParams, "atomic_counters_array_indexing", "Test 3"));

	/* Uniform Blocks Array Indexing (Test 4) */
	addChild(
		new GPUShader5UniformBlocksArrayIndexing(m_context, m_extParams, "uniform_blocks_array_indexing", "Test 4"));

	if (m_glslVersion >= glu::GLSL_VERSION_430)
	{
		/* SSBO Array Indexing (Test 5) applicable only to OpenGL 4.x*/
		addChild(new GPUShader5SSBOArrayIndexing(m_context, m_extParams, "ssbo_array_indexing", "Test 5"));
	}

	/* GPUShader5 Precise Qualifier (Test 6) */
	addChild(new GPUShader5PreciseQualifier(m_context, m_extParams, "precise_qualifier", "Test 6"));

	/* Accuracy of the fma function (Test 7) */
	addChild(new GPUShader5FmaAccuracyTest(m_context, m_extParams, "fma_accuracy", "Test 7"));

	/* Uniform Blocks Array Indexing (Test 8) */
	addChild(new GPUShader5FmaPrecision<IDT_FLOAT>(m_context, m_extParams, "fma_precision_float", "Test 8 float"));
	addChild(new GPUShader5FmaPrecision<IDT_VEC2>(m_context, m_extParams, "fma_precision_vec2", "Test 8 vec2"));
	addChild(new GPUShader5FmaPrecision<IDT_VEC3>(m_context, m_extParams, "fma_precision_vec3", "Test 8 vec3"));
	addChild(new GPUShader5FmaPrecision<IDT_VEC4>(m_context, m_extParams, "fma_precision_vec4", "Test 8 vec4"));

	/* Texture gather offset (Tests 9, 10 and 11) */
	addChild(new GPUShader5TextureGatherOffsetColor2DRepeatCaseTest(
		m_context, m_extParams, "texture_gather_offset_color_repeat", "Test 9 - Color repeat case"));
	addChild(new GPUShader5TextureGatherOffsetColor2DArrayCaseTest(
		m_context, m_extParams, "texture_gather_offset_color_array", "Test 9 - Color texture array case"));
	addChild(new GPUShader5TextureGatherOffsetColor2DOffsetsCaseTest(
		m_context, m_extParams, "texture_gather_offsets_color", "Test 9 - Color offsets case"));
	addChild(new GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest(
		m_context, m_extParams, "texture_gather_offset_depth_repeat", "Test 10 - Depth repeat case"));
	addChild(new GPUShader5TextureGatherOffsetDepth2DRepeatYCaseTest(
		m_context, m_extParams, "texture_gather_offset_depth_repeat_y", "Test 10 - Depth repeat, vertical case"));
	addChild(new GPUShader5TextureGatherOffsetDepth2DArrayCaseTest(
		m_context, m_extParams, "texture_gather_offset_depth_array", "Test 10 - Depth array case"));
	addChild(new GPUShader5TextureGatherOffsetDepth2DOffsetsCaseTest(
		m_context, m_extParams, "texture_gather_offsets_depth", "Test 10 - Depth offsets case"));
	addChild(new GPUShader5TextureGatherOffsetColor2DClampToBorderCaseTest(
		m_context, m_extParams, "texture_gather_offset_color_clamp_to_border", "Test 11 - Color clamp to border case"));
	addChild(new GPUShader5TextureGatherOffsetColor2DClampToEdgeCaseTest(
		m_context, m_extParams, "texture_gather_offset_color_clamp_to_edge", "Test 11 - Color clamp to edge case"));
	addChild(new GPUShader5TextureGatherOffsetDepth2DClampToBorderCaseTest(
		m_context, m_extParams, "texture_gather_offset_depth_clamp_border", "Test 11 - Depth clamp to border case"));
	addChild(new GPUShader5TextureGatherOffsetDepth2DClampToEdgeCaseTest(
		m_context, m_extParams, "texture_gather_offset_depth_clamp_edge", "Test 11 - Depth clamp to edge case"));
}